

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicProgramQuery::Run(BasicProgramQuery *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  GLuint GVar5;
  mapped_type *pmVar6;
  Vector<float,_4> *this_00;
  float *pfVar7;
  pair<char_*,_unsigned_int> pVar8;
  __enable_if_t<is_constructible<value_type,_pair<char_*,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var9;
  Vec4 *data_out;
  long error;
  uint data [8];
  allocator<char> local_1f9;
  key_type local_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  allocator<char> local_1a9;
  key_type local_1a8;
  allocator<char> local_181;
  key_type local_180;
  allocator<char> local_159;
  key_type local_158;
  allocator<char> local_131;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  _Base_ptr local_e8;
  undefined1 local_e0;
  char *local_d8;
  uint local_d0;
  pair<char_*,_unsigned_int> local_c8;
  GLchar local_b8 [8];
  GLchar name [32];
  GLuint index;
  undefined1 local_88 [4];
  GLuint active_uniforms;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  uniforms_name_index;
  GLuint active_buffers;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicProgramQuery *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump vec4 data;\n} g_out;\nlayout(binding = 0, offset = 0)  uniform atomic_uint ac_counter0;\nlayout(binding = 0, offset = 4)  uniform atomic_uint ac_counter1;\nlayout(binding = 0)              uniform atomic_uint ac_counter2;\nlayout(binding = 0)              uniform atomic_uint ac_counter67[2];\nlayout(binding = 0)              uniform atomic_uint ac_counter3;\nlayout(binding = 0)              uniform atomic_uint ac_counter4;\nlayout(binding = 0)              uniform atomic_uint ac_counter5;\nvoid main() {\n  mediump uint c = 0u;\n  c += atomicCounterIncrement(ac_counter0);\n  c += atomicCounterIncrement(ac_counter1);\n  c += atomicCounterIncrement(ac_counter2);\n  c += atomicCounterIncrement(ac_counter3);\n  c += atomicCounterIncrement(ac_counter4);\n  c += atomicCounterIncrement(ac_counter5);\n  c += atomicCounterIncrement(ac_counter67[0]);\n  c += atomicCounterIncrement(ac_counter67[1]);\n  if (c > 10u) g_out.data = vec4(0.0, 1.0, 0.0, 1.0);\n  else g_out.data = vec4(1.0, float(c), 0.0, 1.0);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump vec4 data;\n} g_out;\nlayout(binding = 0, offset = 0)  uniform atomic_uint ac_counter0;\nlayout(binding = 0, offset = 4)  uniform atomic_uint ac_counter1;\nlayout(binding = 0)              uniform atomic_uint ac_counter2;\nlayout(binding = 0)              uniform atomic_uint ac_counter67[2];\nlayout(binding = 0)              uniform atomic_uint ac_counter3;\nlayout(binding = 0)              uniform atomic_uint ac_counter4;\nlayout(binding = 0)              uniform atomic_uint ac_counter5;\nvoid main() {\n  mediump uint c = 0u;\n  c += atomicCounterIncrement(ac_counter0);\n  c += atomicCounterIncrement(ac_counter1);\n  c += atomicCounterIncrement(ac_counter2);\n  c += atomicCounterIncrement(ac_counter3);\n  c += atomicCounterIncrement(ac_counter4);\n  c += atomicCounterIncrement(ac_counter5);\n  c += atomicCounterIncrement(ac_counter67[0]);\n  c += atomicCounterIncrement(ac_counter67[1]);\n  if (c > 10u) g_out.data = vec4(0.0, 1.0, 0.0, 1.0);\n  else g_out.data = vec4(1.0, float(c), 0.0, 1.0);\n}"
             ,&local_41);
  GVar5 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_40);
  this->prog_ = GVar5;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->prog_);
  bVar4 = BasicUsageCS::CheckProgram(&this->super_BasicUsageCS,this->prog_,(bool *)0x0);
  if (!bVar4) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    return (long)this_local;
  }
  glu::CallLogWrapper::glUseProgram
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->prog_);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->prog_,0x92d9,
             (GLint *)&uniforms_name_index._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((uint)uniforms_name_index._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
    glcts::anon_unknown_0::Output
              ("GL_ACTIVE_ATOMIC_COUNTER_BUFFERS is %u should be %d.\n",
               (ulong)(uint)uniforms_name_index._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    return (long)this_local;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_88);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->prog_,0x8b86,(GLint *)&index);
  if (index != 7) {
    glcts::anon_unknown_0::Output("GL_ACTIVE_UNIFORMS is %u should be %d.\n",(ulong)index,8);
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  for (; (uint)name._28_4_ < index; name._28_4_ = name._28_4_ + 1) {
    glu::CallLogWrapper::glGetProgramResourceName
              (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->prog_,0x92e1,name._28_4_,0x20,(GLsizei *)0x0,local_b8);
    pVar8 = std::make_pair<char(&)[32],unsigned_int&>((char (*) [32])local_b8,(uint *)(name + 0x1c))
    ;
    local_d8 = pVar8.first;
    local_d0 = pVar8.second;
    local_c8.first = local_d8;
    local_c8.second = local_d0;
    _Var9 = std::
            map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::insert<std::pair<char*,unsigned_int>>
                      ((map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)local_88,&local_c8);
    local_e8 = (_Base_ptr)_Var9.first._M_node;
    local_e0 = _Var9.second;
  }
  GVar5 = this->prog_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"ac_counter0",&local_109);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_108);
  bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                    ((SACSubcaseBase *)this,GVar5,"ac_counter0",*pmVar6,0x92db,1,0,0);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  GVar5 = this->prog_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"ac_counter1",&local_131);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_130);
  bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                    ((SACSubcaseBase *)this,GVar5,"ac_counter1",*pmVar6,0x92db,1,4,0);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  GVar5 = this->prog_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"ac_counter2",&local_159);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_158);
  bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                    ((SACSubcaseBase *)this,GVar5,"ac_counter2",*pmVar6,0x92db,1,8,0);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  GVar5 = this->prog_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"ac_counter3",&local_181);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_180);
  bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                    ((SACSubcaseBase *)this,GVar5,"ac_counter3",*pmVar6,0x92db,1,0x14,0);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  GVar5 = this->prog_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"ac_counter4",&local_1a9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_1a8);
  bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                    ((SACSubcaseBase *)this,GVar5,"ac_counter4",*pmVar6,0x92db,1,0x18,0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  GVar5 = this->prog_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"ac_counter5",&local_1d1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_1d0);
  bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                    ((SACSubcaseBase *)this,GVar5,"ac_counter5",*pmVar6,0x92db,1,0x1c,0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  GVar5 = this->prog_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"ac_counter67[0]",&local_1f9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_1f8);
  bVar4 = glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
                    ((SACSubcaseBase *)this,GVar5,"ac_counter67[0]",*pmVar6,0x92db,2,0xc,4);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    this_local = (BasicProgramQuery *)&DAT_ffffffffffffffff;
    goto LAB_01458580;
  }
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,(GLuint *)&(this->super_BasicUsageCS).field_0x34);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x92c0,0,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
  data[2] = 0x14;
  data[3] = 0x14;
  data[4] = 0x14;
  data[5] = 0x14;
  error = 0x1400000014;
  data[0] = 0x14;
  data[1] = 0x14;
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x92c0,0x20,&error,0x88e8);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x92c0,0);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_buffer);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0,this->m_buffer);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0x10,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0);
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,1,1);
  data_out = (Vec4 *)0x0;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,this->m_buffer);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x1200);
  this_00 = (Vector<float,_4> *)
            glu::CallLogWrapper::glMapBufferRange
                      (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,1);
  pfVar7 = tcu::Vector<float,_4>::x(this_00);
  if ((*pfVar7 != 0.0) || (NAN(*pfVar7))) {
LAB_01458460:
    pfVar7 = tcu::Vector<float,_4>::x(this_00);
    fVar1 = *pfVar7;
    pfVar7 = tcu::Vector<float,_4>::y(this_00);
    fVar2 = *pfVar7;
    pfVar7 = tcu::Vector<float,_4>::z(this_00);
    fVar3 = *pfVar7;
    pfVar7 = tcu::Vector<float,_4>::w(this_00);
    glcts::anon_unknown_0::Output
              ("Expected vec4(0, 1, 0, 1) in the buffer, got: %f %f %f %f\n",SUB84((double)fVar1,0),
               (double)fVar2,(double)fVar3,(double)*pfVar7);
    data_out = (Vec4 *)&DAT_ffffffffffffffff;
  }
  else {
    pfVar7 = tcu::Vector<float,_4>::y(this_00);
    if ((*pfVar7 != 1.0) || (NAN(*pfVar7))) goto LAB_01458460;
    pfVar7 = tcu::Vector<float,_4>::z(this_00);
    if ((*pfVar7 != 0.0) || (NAN(*pfVar7))) goto LAB_01458460;
    pfVar7 = tcu::Vector<float,_4>::w(this_00);
    if ((*pfVar7 != 1.0) || (NAN(*pfVar7))) goto LAB_01458460;
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,0);
  this_local = (BasicProgramQuery *)data_out;
LAB_01458580:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_88);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		// create program
		const char* glsl_cs =
			NL "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;" NL "layout(std430) buffer Output {" NL
			   "  mediump vec4 data;" NL "} g_out;" NL
			   "layout(binding = 0, offset = 0)  uniform atomic_uint ac_counter0;" NL
			   "layout(binding = 0, offset = 4)  uniform atomic_uint ac_counter1;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter2;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter67[2];" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter3;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter4;" NL
			   "layout(binding = 0)              uniform atomic_uint ac_counter5;" NL "void main() {" NL
			   "  mediump uint c = 0u;" NL "  c += atomicCounterIncrement(ac_counter0);" NL
			   "  c += atomicCounterIncrement(ac_counter1);" NL "  c += atomicCounterIncrement(ac_counter2);" NL
			   "  c += atomicCounterIncrement(ac_counter3);" NL "  c += atomicCounterIncrement(ac_counter4);" NL
			   "  c += atomicCounterIncrement(ac_counter5);" NL "  c += atomicCounterIncrement(ac_counter67[0]);" NL
			   "  c += atomicCounterIncrement(ac_counter67[1]);" NL
			   "  if (c > 10u) g_out.data = vec4(0.0, 1.0, 0.0, 1.0);" NL
			   "  else g_out.data = vec4(1.0, float(c), 0.0, 1.0);" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;
		glUseProgram(prog_);

		// get active buffers
		GLuint active_buffers;
		glGetProgramiv(prog_, GL_ACTIVE_ATOMIC_COUNTER_BUFFERS, reinterpret_cast<GLint*>(&active_buffers));
		if (active_buffers != 1)
		{
			Output("GL_ACTIVE_ATOMIC_COUNTER_BUFFERS is %u should be %d.\n", active_buffers, 1);
			return ERROR;
		}

		// get active uniforms
		std::map<std::string, GLuint> uniforms_name_index;
		GLuint active_uniforms;
		glGetProgramiv(prog_, GL_ACTIVE_UNIFORMS, reinterpret_cast<GLint*>(&active_uniforms));
		if (active_uniforms != 7)
		{
			Output("GL_ACTIVE_UNIFORMS is %u should be %d.\n", active_uniforms, 8);
			return ERROR;
		}
		for (GLuint index = 0; index < active_uniforms; ++index)
		{
			GLchar name[32];
			glGetProgramResourceName(prog_, GL_UNIFORM, index, sizeof(name), NULL, name);
			uniforms_name_index.insert(std::make_pair(name, index));
		}

		if (!CheckUniform(prog_, "ac_counter0", uniforms_name_index["ac_counter0"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  0, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter1", uniforms_name_index["ac_counter1"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  4, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter2", uniforms_name_index["ac_counter2"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  8, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter3", uniforms_name_index["ac_counter3"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  20, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter4", uniforms_name_index["ac_counter4"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  24, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter5", uniforms_name_index["ac_counter5"], GL_UNSIGNED_INT_ATOMIC_COUNTER, 1,
						  28, 0))
			return ERROR;
		if (!CheckUniform(prog_, "ac_counter67[0]", uniforms_name_index["ac_counter67[0]"],
						  GL_UNSIGNED_INT_ATOMIC_COUNTER, 2, 12, 4))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		const unsigned int data[8] = { 20, 20, 20, 20, 20, 20, 20, 20 };
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Vec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glDispatchCompute(1, 1, 1);

		long  error = NO_ERROR;
		Vec4* data_out;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_ATOMIC_COUNTER_BARRIER_BIT);
		data_out = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (data_out[0].x() != 0.0 || data_out[0].y() != 1.0 || data_out[0].z() != 0.0 || data_out[0].w() != 1.0)
		{
			Output("Expected vec4(0, 1, 0, 1) in the buffer, got: %f %f %f %f\n", data_out[0].x(), data_out[0].y(),
				   data_out[0].z(), data_out[0].w());
			error = ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return error;
	}